

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_xprt.c
# Opt level: O0

void svc_xprt_shutdown(void)

{
  rbtree_x_part *prVar1;
  int iVar2;
  opr_rbtree_node *node;
  int rc_4;
  int rc_3;
  int rc_2;
  int rc_1;
  int rc;
  int p_ix;
  rpc_dplx_rec *rec;
  opr_rbtree_node *n;
  rbtree_x_part *t;
  
  if (initialized) {
    for (rc_1 = 0; prVar1 = svc_xprt_fd.xt.tree, rc_1 < 0xc1; rc_1 = rc_1 + 1) {
      iVar2 = pthread_rwlock_wrlock((pthread_rwlock_t *)&svc_xprt_fd.xt.tree[rc_1].lock);
      if (iVar2 != 0) {
        abort();
      }
      while (node = opr_rbtree_first(&prVar1[rc_1].t), node != (opr_rbtree_node *)0x0) {
        opr_rbtree_remove(&prVar1[rc_1].t,node);
        iVar2 = pthread_rwlock_unlock((pthread_rwlock_t *)&prVar1[rc_1].lock);
        if (iVar2 != 0) {
          abort();
        }
        svc_destroy_it((SVCXPRT *)&node[-0x1a].red,"svc_xprt_shutdown",0x175);
        iVar2 = pthread_rwlock_wrlock((pthread_rwlock_t *)&prVar1[rc_1].lock);
        if (iVar2 != 0) {
          abort();
        }
      }
      iVar2 = pthread_rwlock_unlock((pthread_rwlock_t *)&prVar1[rc_1].lock);
      if (iVar2 != 0) {
        abort();
      }
      iVar2 = pthread_rwlock_destroy((pthread_rwlock_t *)&prVar1[rc_1].lock);
      if (iVar2 != 0) {
        abort();
      }
    }
    mem_free(svc_xprt_fd.xt.tree,0xd920);
  }
  return;
}

Assistant:

void
svc_xprt_shutdown()
{
	struct rbtree_x_part *t;
	struct opr_rbtree_node *n;
	struct rpc_dplx_rec *rec;
	int p_ix;

	if (!initialized)
		return;

	p_ix = 0;
	while (p_ix < SVC_XPRT_PARTITIONS) {
		t = &svc_xprt_fd.xt.tree[p_ix];

		rwlock_wrlock(&t->lock);	/* t WLOCKED */
		while ((n = opr_rbtree_first(&t->t))) {
			rec = opr_containerof(n, struct rpc_dplx_rec, fd_node);

			/* prevent repeats, see svc_xprt_clear() */
			opr_rbtree_remove(&t->t, &rec->fd_node);

			/* fd_node is counted by initial xp_refcnt = 1,
			 * SVC_DESTROY() decrements that reference.
			 */
			rwlock_unlock(&t->lock);
			SVC_DESTROY(&rec->xprt);
			rwlock_wrlock(&t->lock);
		}		/* curr partition */
		rwlock_unlock(&t->lock);	/* t !LOCKED */
		rwlock_destroy(&t->lock);
		p_ix++;
	}			/* SVC_XPRT_PARTITIONS */

	/* free tree */
	mem_free(svc_xprt_fd.xt.tree,
		 SVC_XPRT_PARTITIONS * sizeof(struct rbtree_x_part));
}